

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.cpp
# Opt level: O0

void __thiscall RPCClient::_DoConnect(RPCClient *this,Handle *handle,uint32_t err)

{
  SingletonLogger *this_00;
  element_type *peVar1;
  uint32_t err_local;
  Handle *handle_local;
  RPCClient *this_local;
  
  if (err == 0) {
    std::shared_ptr<cppnet::CNSocket>::operator=(&this->_socket,handle);
    this->_connected = true;
    peVar1 = std::__shared_ptr_access<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)handle);
    (*peVar1->_vptr_CNSocket[5])(peVar1,"\r\n\r\n",4);
  }
  else {
    this_00 = cppnet::Singleton<cppnet::SingletonLogger>::Instance();
    cppnet::SingletonLogger::Error
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/test/rpc/rpc_client.cpp"
               ,0x59,"connect failed! err : %d",(ulong)err);
  }
  return;
}

Assistant:

void RPCClient::_DoConnect(cppnet::Handle handle, uint32_t err) {
    if (err != cppnet::CEC_SUCCESS) {
        cppnet::LOG_ERROR("connect failed! err : %d", err);
        return;
    }
    _socket = handle;
    _connected = true;
    handle->Write("\r\n\r\n", strlen("\r\n\r\n"));
}